

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::WATParser::TypeUse> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::makeTypeUse
          (Result<wasm::WATParser::TypeUse> *__return_storage_ptr__,ParseModuleTypesCtx *this,
          Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
          type,ParamsT *params,ResultsT *results)

{
  pointer pNVar1;
  const_iterator cVar2;
  NameType *p;
  pointer __x;
  HeapType local_78;
  _Vector_base<wasm::Name,_std::allocator<wasm::Name>_> local_70;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> ids;
  Index local_34 [2];
  Index pos_local;
  
  auStack_58 = (undefined1  [8])0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_34[0] = pos;
  if (params != (ParamsT *)0x0) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    pNVar1 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl
               .super__Vector_impl_data._M_start; __x != pNVar1; __x = __x + 1) {
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,&__x->name);
    }
  }
  if (type.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
      ._M_engaged == true) {
    local_78.id = (uintptr_t)
                  type.
                  super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  ._M_payload._M_value.type.id;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_70,
               (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
    _Variant_storage<0ul,wasm::WATParser::TypeUse>
              ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)__return_storage_ptr__,
               &local_78);
  }
  else {
    cVar2 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->implicitTypes->_M_h,local_34);
    if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false>._M_cur
        == (__node_type *)0x0) {
      __assert_fail("it != implicitTypes.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                    ,0x527,
                    "Result<TypeUseT> wasm::WATParser::ParseModuleTypesCtx::makeTypeUse(Index, std::optional<HeapTypeT>, ParamsT *, ResultsT *)"
                   );
    }
    local_78.id = *(uintptr_t *)
                   ((long)cVar2.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false>
                          ._M_cur + 0x10);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_70,
               (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
    _Variant_storage<0ul,wasm::WATParser::TypeUse>
              ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)__return_storage_ptr__,
               &local_78);
  }
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_70);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
  return __return_storage_ptr__;
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT> type,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Name> ids;
    if (params) {
      ids.reserve(params->size());
      for (auto& p : *params) {
        ids.push_back(p.name);
      }
    }

    if (type) {
      return TypeUse{*type, ids};
    }

    auto it = implicitTypes.find(pos);
    assert(it != implicitTypes.end());

    return TypeUse{it->second, ids};
  }